

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.h
# Opt level: O1

void __thiscall
kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::~ExternalMutexGuarded
          (ExternalMutexGuarded<capnp::compiler::BrandedDecl> *this)

{
  BrandScope *pBVar1;
  Disposer *pDVar2;
  BrandedDecl local_c8;
  undefined1 local_20;
  
  if (this->mutex != (Mutex *)0x0) {
    local_20 = 0;
    kj::_::Mutex::lock(this->mutex,0);
    local_c8.body.tag = 0;
    local_c8.brand.disposer = (Disposer *)0x0;
    local_c8.brand.ptr = (BrandScope *)0x0;
    local_c8.source._reader.segment = (SegmentReader *)0x0;
    local_c8.source._reader.capTable = (CapTableReader *)0x0;
    local_c8.source._reader.data = (void *)0x0;
    local_c8.source._reader.pointers._0_6_ = 0;
    local_c8.source._reader.pointers._6_2_ = 0;
    local_c8.source._reader.dataSize = 0;
    local_c8.source._reader.pointerCount = 0;
    local_c8.source._reader.nestingLimit = 0x7fffffff;
    capnp::compiler::BrandedDecl::operator=(&this->value,&local_c8);
    if (local_c8.brand.ptr != (BrandScope *)0x0) {
      local_c8.brand.ptr = (BrandScope *)0x0;
      (**(local_c8.brand.disposer)->_vptr_Disposer)();
    }
    if (local_c8.body.tag == 1) {
      local_c8.body.tag = 0;
    }
    if (local_c8.body.tag == 2) {
      local_c8.body.tag = 0;
    }
    kj::_::Mutex::unlock(this->mutex,EXCLUSIVE,(Waiter *)0x0);
  }
  pBVar1 = (this->value).brand.ptr;
  if (pBVar1 != (BrandScope *)0x0) {
    (this->value).brand.ptr = (BrandScope *)0x0;
    pDVar2 = (this->value).brand.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(pBVar1->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
                      (long)&(pBVar1->super_Refcounted).super_Disposer._vptr_Disposer);
  }
  if ((this->value).body.tag == 1) {
    (this->value).body.tag = 0;
  }
  if ((this->value).body.tag == 2) {
    (this->value).body.tag = 0;
  }
  return;
}

Assistant:

~ExternalMutexGuarded() noexcept(false) {
    if (mutex != nullptr) {
      mutex->lock(_::Mutex::EXCLUSIVE, kj::none, location);
      KJ_DEFER(mutex->unlock(_::Mutex::EXCLUSIVE));
      value = T();
    }
  }